

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O1

int nc_match(GENERAL_NAME *gen,NAME_CONSTRAINTS *nc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  size_t sVar6;
  
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)nc->permittedSubtrees);
  if (sVar4 != 0) {
    sVar4 = 0;
    iVar3 = 0;
    do {
      puVar5 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nc->permittedSubtrees,sVar4);
      iVar1 = iVar3;
      if (gen->type == ((GENERAL_NAME *)*puVar5)->type) {
        if (puVar5[1] != 0) {
          return 0x31;
        }
        if (puVar5[2] != 0) {
          return 0x31;
        }
        iVar1 = 2;
        if (((iVar3 != 2) && (iVar2 = nc_match_single(gen,(GENERAL_NAME *)*puVar5), iVar2 != 0)) &&
           (iVar1 = iVar3 + (uint)(iVar3 == 0), iVar2 != 0x2f)) {
          return iVar2;
        }
      }
      iVar3 = iVar1;
      sVar4 = sVar4 + 1;
      sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)nc->permittedSubtrees);
    } while (sVar4 < sVar6);
    if (iVar3 == 1) {
      return 0x2f;
    }
  }
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)nc->excludedSubtrees);
  if (sVar4 != 0) {
    sVar4 = 0;
    do {
      puVar5 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nc->excludedSubtrees,sVar4);
      if (gen->type == ((GENERAL_NAME *)*puVar5)->type) {
        if (puVar5[1] != 0) {
          return 0x31;
        }
        if (puVar5[2] != 0) {
          return 0x31;
        }
        iVar3 = nc_match_single(gen,(GENERAL_NAME *)*puVar5);
        if (iVar3 != 0x2f) {
          if (iVar3 == 0) {
            return 0x30;
          }
          return iVar3;
        }
      }
      sVar4 = sVar4 + 1;
      sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)nc->excludedSubtrees);
    } while (sVar4 < sVar6);
  }
  return 0;
}

Assistant:

static int nc_match(GENERAL_NAME *gen, NAME_CONSTRAINTS *nc) {
  GENERAL_SUBTREE *sub;
  int r, match = 0;
  size_t i;

  // Permitted subtrees: if any subtrees exist of matching the type at
  // least one subtree must match.

  for (i = 0; i < sk_GENERAL_SUBTREE_num(nc->permittedSubtrees); i++) {
    sub = sk_GENERAL_SUBTREE_value(nc->permittedSubtrees, i);
    if (gen->type != sub->base->type) {
      continue;
    }
    if (sub->minimum || sub->maximum) {
      return X509_V_ERR_SUBTREE_MINMAX;
    }
    // If we already have a match don't bother trying any more
    if (match == 2) {
      continue;
    }
    if (match == 0) {
      match = 1;
    }
    r = nc_match_single(gen, sub->base);
    if (r == X509_V_OK) {
      match = 2;
    } else if (r != X509_V_ERR_PERMITTED_VIOLATION) {
      return r;
    }
  }

  if (match == 1) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  // Excluded subtrees: must not match any of these

  for (i = 0; i < sk_GENERAL_SUBTREE_num(nc->excludedSubtrees); i++) {
    sub = sk_GENERAL_SUBTREE_value(nc->excludedSubtrees, i);
    if (gen->type != sub->base->type) {
      continue;
    }
    if (sub->minimum || sub->maximum) {
      return X509_V_ERR_SUBTREE_MINMAX;
    }

    r = nc_match_single(gen, sub->base);
    if (r == X509_V_OK) {
      return X509_V_ERR_EXCLUDED_VIOLATION;
    } else if (r != X509_V_ERR_PERMITTED_VIOLATION) {
      return r;
    }
  }

  return X509_V_OK;
}